

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *pCVar1;
  conncache *h;
  size_t sVar2;
  long lVar3;
  CURLcode CVar4;
  connectbundle *cb_ptr;
  size_t key_len;
  void *pvVar5;
  size_t len;
  char key [128];
  
  pCVar1 = conn->data;
  cb_ptr = Curl_conncache_find_bundle(conn,(pCVar1->state).conn_cache);
  if (cb_ptr == (connectbundle *)0x0) {
    cb_ptr = (connectbundle *)(*Curl_cmalloc)(0x30);
    if (cb_ptr != (connectbundle *)0x0) {
      cb_ptr->num_connections = 0;
      cb_ptr->multiuse = 0;
      Curl_llist_init(&cb_ptr->conn_list,conn_llist_dtor);
      hashkey(conn,key,len);
      h = (pCVar1->state).conn_cache;
      key_len = strlen(key);
      pvVar5 = Curl_hash_add(&h->hash,key,key_len,cb_ptr);
      if (pvVar5 != (void *)0x0) goto LAB_004bd1d3;
      bundle_destroy(cb_ptr);
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_004bd1d3:
    Curl_llist_insert_next(&cb_ptr->conn_list,(cb_ptr->conn_list).tail,conn,&conn->bundle_node);
    conn->bundle = cb_ptr;
    cb_ptr->num_connections = cb_ptr->num_connections + 1;
    sVar2 = connc->num_connections;
    lVar3 = connc->next_connection_id;
    conn->connection_id = lVar3;
    connc->num_connections = sVar2 + 1;
    connc->next_connection_id = lVar3 + 1;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    int rc;
    char key[128];

    result = bundle_create(data, &new_bundle);
    if(result)
      return result;

    hashkey(conn, key, sizeof(key));
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_connections));

  return CURLE_OK;
}